

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O2

void testQuantizer(float tol)

{
  float srcFloat;
  imath_half_bits_t herrTol;
  uint16_t uVar1;
  uint16_t uVar2;
  uint uVar3;
  uint16_t src;
  int h;
  ulong uVar4;
  
  herrTol = imath_float_to_half(tol);
  uVar3 = 0;
  for (uVar4 = 0; uVar4 != 0x10000; uVar4 = uVar4 + 1) {
    srcFloat = *(float *)(_imath_half_to_float_table + uVar4 * 4);
    src = (uint16_t)uVar4;
    uVar1 = tableQuantize(src,tol,srcFloat,0);
    uVar2 = algoQuantize(src,herrTol,tol,srcFloat,0);
    if (uVar1 != uVar2) {
      uVar3 = uVar3 + 1;
      if (testQuantizer(float)::didfirstprint == '\0') {
        uVar1 = tableQuantize(src,tol,srcFloat,1);
        uVar2 = algoQuantize(src,herrTol,tol,srcFloat,1);
        testQuantizer(float)::didfirstprint = '\x01';
        printf("ERROR: tol %g half %u 0x%04X %g: table 0x%04X %g algo 0x%04X %g\n",(double)tol,
               (double)*(float *)(_imath_half_to_float_table + uVar4 * 4),
               (double)*(float *)(_imath_half_to_float_table + (ulong)uVar1 * 4),
               (double)*(float *)(_imath_half_to_float_table + (ulong)uVar2 * 4),uVar4 & 0xffffffff,
               uVar4 & 0xffffffff);
      }
    }
  }
  if (0 < (int)uVar3) {
    printf("ERROR: tol %g: %d fails\n",(double)tol,(ulong)uVar3);
    return;
  }
  return;
}

Assistant:

static void testQuantizer (float tol)
{
    uint16_t halfTol = imath_float_to_half (tol);

    int failcount = 0;
    for ( int h = 0; h < 65536; ++h )
    {
        uint16_t hval = h;
        float    hFloat = imath_half_to_float (hval);
        uint16_t tq = tableQuantize (hval, tol, hFloat, 0);
        uint16_t aq = algoQuantize (hval, halfTol, tol, hFloat, 0);

        if (tq != aq)
        {
            static int didfirstprint = 0;
            ++failcount;
            if (didfirstprint == 0)
            {
                tq = tableQuantize (hval, tol, hFloat, 1);
                aq = algoQuantize (hval, halfTol, tol, hFloat, 1);
                didfirstprint = 1;
                printf ("ERROR: tol %g half %u 0x%04X %g: table 0x%04X %g algo 0x%04X %g\n",
                        tol, hval, hval, imath_half_to_float (hval),
                        tq, imath_half_to_float (tq),
                        aq, imath_half_to_float (aq));
            }
        }
        //EXRCORE_TEST (tableQuantize (hval, tol) == algoQuantize (hval, halfTol));
    }
    if (failcount > 0)
        printf ("ERROR: tol %g: %d fails\n", tol, failcount);
    //else
    //    printf ("SUCCESS: tol %g: %d fails\n", tol, failcount);
}